

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void import_kernel_cmdline(int in_qemu)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char cmdline [1024];
  
  iVar1 = open("/proc/cmdline",0);
  if (iVar1 < 0) {
    cmdline[0] = '\0';
    pcVar7 = cmdline;
  }
  else {
    sVar3 = read(iVar1,cmdline,0x3ff);
    uVar2 = (uint)sVar3;
    uVar6 = 0;
    if ((0 < (int)uVar2) && (uVar6 = uVar2, cmdline[uVar2 - 1] == '\n')) {
      uVar6 = uVar2 - 1;
    }
    cmdline[(int)uVar6] = '\0';
    close(iVar1);
    pcVar7 = cmdline;
  }
  do {
    while( true ) {
      do {
        pcVar5 = pcVar7;
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          chmod("/proc/cmdline",0x120);
          return;
        }
        pcVar4 = strchr(pcVar5,0x20);
        if (pcVar4 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = pcVar4 + 1;
          *pcVar4 = '\0';
        }
        pcVar4 = strchr(pcVar5,0x3d);
      } while (((pcVar4 == (char *)0x0) || (*pcVar4 = '\0', in_qemu != 0)) || (*pcVar5 == '\0'));
      iVar1 = strcmp(pcVar5,"qemu");
      if (iVar1 != 0) break;
      pcVar5 = qemu;
LAB_00105f20:
      strlcpy(pcVar5,pcVar4 + 1,0x20);
    }
    iVar1 = strcmp(pcVar5,"androidboot.console");
    if (iVar1 == 0) {
      pcVar5 = console;
      goto LAB_00105f20;
    }
    iVar1 = strcmp(pcVar5,"androidboot.mode");
    if (iVar1 == 0) {
      pcVar5 = bootmode;
      goto LAB_00105f20;
    }
    qemu_cmdline(pcVar5,pcVar4 + 1);
  } while( true );
}

Assistant:

static void import_kernel_cmdline(int in_qemu)
{
    char cmdline[1024];
    char *ptr;
    int fd;

    fd = open("/proc/cmdline", O_RDONLY);
    if (fd >= 0) {
        int n = read(fd, cmdline, 1023);
        if (n < 0) n = 0;

        /* get rid of trailing newline, it happens */
        if (n > 0 && cmdline[n-1] == '\n') n--;

        cmdline[n] = 0;
        close(fd);
    } else {
        cmdline[0] = 0;
    }

    ptr = cmdline;
    while (ptr && *ptr) {
        char *x = strchr(ptr, ' ');
        if (x != 0) *x++ = 0;
        import_kernel_nv(ptr, in_qemu);
        ptr = x;
    }

        /* don't expose the raw commandline to nonpriv processes */
    chmod("/proc/cmdline", 0440);
}